

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom64.cc
# Opt level: O3

int test_atom64(hwtest_ctx *ctx)

{
  unsigned_short *__xsubi;
  undefined8 uVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  nva_card **ppnVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint64_t uVar16;
  int iVar17;
  uint local_3064;
  ulong local_3060;
  uint64_t src1 [512];
  uint64_t src3 [512];
  uint64_t src2 [512];
  uint64_t uStack_38;
  
  __xsubi = ctx->rand48;
  iVar17 = 0;
  do {
    lVar9 = jrand48(__xsubi);
    uVar15 = (uint)lVar9 & 0xfff0000 | 0xd0000011;
    local_3060 = (ulong)uVar15;
    uVar10 = jrand48(__xsubi);
    uVar6 = (uint)uVar10;
    local_3064 = uVar6 & 0x3f1ff03c | 0xc08007c0;
    lVar9 = jrand48(__xsubi);
    uVar7 = (uint)(uVar10 >> 2) & 0xf;
    if ((uVar6 >> 0x1d & 1) == 0) {
      if (uVar7 != 2) {
LAB_002daa11:
        if (uVar7 != 3) goto LAB_002daa1a;
      }
    }
    else {
      local_3060 = (ulong)(uVar15 & 0xdf800001 | 0x40020);
      if (uVar7 != 2) goto LAB_002daa11;
      local_3064 = uVar6 & 0x3f00303c | 0xc08187c0;
LAB_002daa1a:
      iVar8 = g80_gr_mthd(ctx,3,0x3a8,0x40);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x3ac,0x10200);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x3b0,1);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x2c0,10);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x2b4,0x10200);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x2b8,1);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x3b8,2);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x2f8,1);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x388,0);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x3a4,0x10001);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x374,0);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,900,0x100);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_mthd(ctx,3,0x37c,((uint)lVar9 & 2) << 0xf | (uint)lVar9 & 1);
      ppnVar5 = nva_cards;
      if (iVar8 != 0) {
        return 3;
      }
      src1[0] = 0xc410078030030001;
      src1[1] = 0x10320008005;
      src1[2] = 0x20320008009;
      src1[3] = 0x3032000800d;
      src1[4] = 0x3100f8011;
      src1[5] = 0xa000078000000801;
      src1[6] = 0x80800780d0000211;
      src1[7] = 0x80800780d0000419;
      src1[8]._0_4_ = (int)local_3060;
      src1[8]._4_4_ = local_3064;
      src1[9] = 0xa0800780d0000421;
      src1[10] = 0x200007800000001d;
      src1[0xb] = 0xa0c00780d000021d;
      src1[0xc] = 0xe0000781f0000001;
      *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x100;
      lVar9 = 0;
      do {
        *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 * 4 + 0x730000) =
             *(undefined4 *)((long)src1 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x1a);
      *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
      do {
      } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
      iVar8 = g80_gr_mthd(ctx,3,0x380,0);
      if (iVar8 != 0) {
        return 3;
      }
      uVar10 = jrand48(__xsubi);
      lVar9 = 0;
      do {
        uVar11 = jrand48(__xsubi);
        lVar12 = jrand48(__xsubi);
        src1[lVar9] = lVar12 << 0x20 | uVar11 & 0xffffffff;
        uVar13 = jrand48(__xsubi);
        lVar12 = jrand48(__xsubi);
        src2[lVar9] = lVar12 << 0x20 | uVar13 & 0xffffffff;
        uVar14 = jrand48(__xsubi);
        lVar12 = jrand48(__xsubi);
        ppnVar5 = nva_cards;
        src3[lVar9] = lVar12 << 0x20 | uVar14 & 0xffffffff;
        if ((uVar10 & 1) != 0) {
          src1[lVar9] = (long)(char)uVar11;
        }
        if ((uVar10 & 2) != 0) {
          src2[lVar9] = (long)(char)uVar13;
        }
        if ((uVar10 & 4) != 0) {
          src3[lVar9] = (long)(char)uVar14;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x200);
      *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x200;
      lVar9 = 0;
      do {
        uVar1 = *(undefined8 *)((long)src1 + lVar9);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x700000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x700004) = (int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)src2 + lVar9);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x701000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x701004) = (int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)((long)src3 + lVar9);
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x702000) = (int)uVar1;
        *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar9 + 0x702004) = (int)((ulong)uVar1 >> 0x20);
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x1000);
      *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
      do {
      } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
      iVar8 = g80_gr_mthd(ctx,3,0x368,0);
      if (iVar8 != 0) {
        return 3;
      }
      iVar8 = g80_gr_idle(ctx);
      if (iVar8 != 0) {
        return 3;
      }
      pvVar2 = nva_cards[ctx->cnum]->bar0;
      lVar9 = -0x200;
      do {
        uVar3 = src3[lVar9];
        uVar4 = (&uStack_38)[lVar9];
        uVar16 = uVar4;
        switch(local_3064 >> 2 & 0xf) {
        case 0:
          uVar16 = uVar4 + uVar3;
          break;
        case 2:
          uVar16 = uVar3;
          if (uVar3 == uVar4) {
            uVar16 = src2[lVar9];
          }
          break;
        case 3:
          abort();
        }
        if (((*(int *)((long)pvVar2 + lVar9 * 8 + 0x702000) != 0xf) ||
            (CONCAT44(*(undefined4 *)((long)pvVar2 + lVar9 * 8 + 0x701004),
                      *(undefined4 *)((long)pvVar2 + lVar9 * 8 + 0x701000)) != uVar16)) ||
           (0xdfffffff < local_3064 &&
            CONCAT44(*(undefined4 *)((long)pvVar2 + lVar9 * 8 + 0x703004),
                     *(undefined4 *)((long)pvVar2 + lVar9 * 8 + 0x703000)) != uVar3)) {
          printf("atom64 %08x %08x (%016lx %016lx %016lx %016lx)[%d]: got %016lx.%x %016lx expected %016lx.%x %016lx\n"
                 ,local_3060,(ulong)local_3064);
          return 3;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
    }
    iVar17 = iVar17 + 1;
    if (iVar17 == 100000) {
      return 1;
    }
  } while( true );
}

Assistant:

static int test_atom64(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000011 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc08007c0 | (jrand48(ctx->rand48) & 0x3f1ff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x040020;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom64_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom64_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint64_t src1[0x200], src2[0x200], src3[0x200];
		atom64_gen(ctx, src1, src2, src3);
		if (atom64_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}